

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::ApplyPendingSkips
          (ColumnReader *this,data_ptr_t define_out,data_ptr_t repeat_out)

{
  idx_t read_count;
  bool bVar1;
  type pRVar2;
  idx_t iVar3;
  ulong read_now;
  data_ptr_t defines;
  
  read_count = this->pending_skips;
  if (read_count == 0) {
    return;
  }
  this->pending_skips = 0;
  BeginRead(this,(data_ptr_t)0x0,(data_ptr_t)0x0);
  iVar3 = read_count;
  do {
    while (read_now = this->page_rows_available, read_now == 0) {
      PrepareRead(this,(optional_ptr<const_duckdb::TableFilter,_true>)0x0,
                  (optional_ptr<duckdb::TableFilterState,_true>)0x0);
    }
    if (iVar3 < read_now) {
      read_now = iVar3;
    }
    if (0x7ff < read_now) {
      read_now = 0x800;
    }
    bVar1 = PrepareRead(this,read_now,define_out,repeat_out,0);
    defines = define_out;
    if (bVar1) {
      defines = (uint8_t *)0x0;
    }
    switch(this->encoding) {
    case DICTIONARY:
      DictionaryDecoder::Skip(&this->dictionary_decoder,defines,read_now);
      break;
    case DELTA_BINARY_PACKED:
      DeltaBinaryPackedDecoder::Skip(&this->delta_binary_packed_decoder,defines,read_now);
      break;
    case RLE:
      RLEDecoder::Skip(&this->rle_decoder,defines,read_now);
      break;
    case DELTA_LENGTH_BYTE_ARRAY:
      DeltaLengthByteArrayDecoder::Skip(&this->delta_length_byte_array_decoder,defines,read_now);
      break;
    case DELTA_BYTE_ARRAY:
      DeltaByteArrayDecoder::Skip(&this->delta_byte_array_decoder,defines,read_now);
      break;
    case BYTE_STREAM_SPLIT:
      ByteStreamSplitDecoder::Skip(&this->byte_stream_split_decoder,defines,read_now);
      break;
    default:
      pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(&this->block);
      (*this->_vptr_ColumnReader[0xd])(this,pRVar2,defines,read_now);
    }
    this->page_rows_available = this->page_rows_available - read_now;
    iVar3 = iVar3 - read_now;
  } while (iVar3 != 0);
  FinishRead(this,read_count);
  return;
}

Assistant:

void ColumnReader::ApplyPendingSkips(data_ptr_t define_out, data_ptr_t repeat_out) {
	if (pending_skips == 0) {
		return;
	}
	idx_t num_values = pending_skips;
	pending_skips = 0;

	auto to_skip = num_values;
	// start reading but do not apply skips (we are skipping now)
	BeginRead(nullptr, nullptr);

	while (to_skip > 0) {
		auto skip_now = ReadPageHeaders(to_skip);
		const auto all_valid = PrepareRead(skip_now, define_out, repeat_out, 0);

		const auto define_ptr = all_valid ? nullptr : static_cast<uint8_t *>(define_out);
		switch (encoding) {
		case ColumnEncoding::DICTIONARY:
			dictionary_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::DELTA_BINARY_PACKED:
			delta_binary_packed_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::RLE:
			rle_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::DELTA_LENGTH_BYTE_ARRAY:
			delta_length_byte_array_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::DELTA_BYTE_ARRAY:
			delta_byte_array_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::BYTE_STREAM_SPLIT:
			byte_stream_split_decoder.Skip(define_ptr, skip_now);
			break;
		default:
			PlainSkip(*block, define_ptr, skip_now);
			break;
		}
		page_rows_available -= skip_now;
		to_skip -= skip_now;
	}
	FinishRead(num_values);
}